

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

Abc_Obj_t *
Abc_NodeFromIf_rec(Abc_Ntk_t *pNtkNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vCover)

{
  If_Cut_t *pCut;
  uint uVar1;
  Vec_Ptr_t *vVisited;
  word wVar2;
  int iVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  Abc_Obj_t *pAVar6;
  word *pwVar7;
  int *pArrTimeProfile;
  If_Par_t *pIVar8;
  Abc_Obj_t *pAVar9;
  DdNode *n;
  undefined8 *puVar10;
  char *pcVar11;
  Hop_Obj_t *pHVar12;
  ulong uVar13;
  word *pwVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  word *pwVar18;
  DdManager *dd;
  Hop_Man_t *pHVar19;
  ulong uVar20;
  ulong uVar21;
  Abc_Obj_t *pFanins [15];
  
  if ((Abc_Obj_t *)(pIfObj->field_22).pCopy != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pIfObj->field_22).pCopy;
  }
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("pIfObj->Type == IF_AND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x1be,
                  "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)")
    ;
  }
  pCut = &pIfObj->CutBest;
  if (pIfMan->pPars->fUserSesLib != 0) {
    uVar21 = 0;
    while ((uVar21 < (byte)(pIfObj->CutBest).field_0x1f &&
           (pIVar5 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar21 * 4)),
           pIVar5 != (If_Obj_t *)0x0))) {
      pAVar6 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar5,vCover);
      pFanins[uVar21] = pAVar6;
      uVar21 = uVar21 + 1;
    }
    pwVar7 = If_CutTruthW(pIfMan,pCut);
    bVar16 = (pIfObj->CutBest).field_0x1f;
    pArrTimeProfile = If_CutArrTimeProfile(pIfMan,pCut);
    pAVar6 = Abc_ExactBuildNode(pwVar7,(uint)bVar16,pArrTimeProfile,pFanins,pNtkNew);
    (pIfObj->field_22).pCopy = pAVar6;
    return pAVar6;
  }
  pAVar6 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  pIVar8 = pIfMan->pPars;
  if ((((pIVar8->fDelayOpt == 0) && (pIVar8->fDelayOptLut == 0)) && (pIVar8->fDsdBalance == 0)) &&
     (((pIVar8->fUseTtPerm == 0 && (pIVar8->pLutStruct == (char *)0x0)) &&
      ((pIVar8->fUserRecLib == 0 && ((pIVar8->fUserSesLib == 0 && (pIVar8->nGateSize == 0)))))))) {
    If_CutRotatePins(pIfMan,pCut);
    pIVar8 = pIfMan->pPars;
  }
  if ((pIVar8->fUseCnfs == 0) && (pIVar8->fUseMv == 0)) {
    uVar21 = 0;
    while ((uVar21 < (byte)(pIfObj->CutBest).field_0x1f &&
           (pIVar5 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar21 * 4)),
           pIVar5 != (If_Obj_t *)0x0))) {
      pAVar9 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar5,vCover);
      Abc_ObjAddFanin(pAVar6,pAVar9);
      uVar21 = uVar21 + 1;
    }
  }
  else {
    uVar21 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
    while ((0 < (long)uVar21 &&
           (pIVar5 = If_ManObj(pIfMan,*(int *)(&(pIfObj->CutBest).field_0x1c + uVar21 * 4)),
           pIVar5 != (If_Obj_t *)0x0))) {
      pAVar9 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar5,vCover);
      Abc_ObjAddFanin(pAVar6,pAVar9);
      uVar21 = uVar21 - 1;
    }
  }
  iVar3 = Abc_ObjLevelNew(pAVar6);
  *(uint *)&pAVar6->field_0x14 = *(uint *)&pAVar6->field_0x14 & 0xfff | iVar3 << 0xc;
  pIVar8 = pIfMan->pPars;
  if (pIVar8->fTruth == 0) {
    uVar4 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    if (uVar4 < 0x2000000) {
      __assert_fail("pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x286,"Hop_Obj_t *Abc_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
    }
    pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
    uVar21 = 0;
    while ((uVar21 < uVar4 >> 0x18 &&
           (pIVar5 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar21 * 4)),
           pIVar5 != (If_Obj_t *)0x0))) {
      pHVar12 = Hop_IthVar(pHVar19,(int)uVar21);
      *(Hop_Obj_t **)&pIVar5->CutBest = pHVar12;
      uVar21 = uVar21 + 1;
      uVar4 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    }
    vVisited = pIfMan->vTemp;
    vVisited->nSize = 0;
    pHVar12 = Abc_NodeIfToHop2_rec(pHVar19,pIfMan,pIfObj,vVisited);
    if (pHVar12 == (Hop_Obj_t *)0x1) {
      puts("Abc_NodeIfToHop(): Computing local AIG has failed.");
      pHVar12 = (Hop_Obj_t *)0x0;
    }
    else {
      uVar21 = 0;
      while ((uVar21 < (byte)(pIfObj->CutBest).field_0x1f &&
             (pIVar5 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar21 * 4)),
             pIVar5 != (If_Obj_t *)0x0))) {
        (pIVar5->CutBest).Area = 0.0;
        (pIVar5->CutBest).Edge = 0.0;
        uVar21 = uVar21 + 1;
      }
      for (iVar3 = 0; iVar3 < pIfMan->vTemp->nSize; iVar3 = iVar3 + 1) {
        puVar10 = (undefined8 *)Vec_PtrEntry(pIfMan->vTemp,iVar3);
        *puVar10 = 0;
      }
    }
    (pAVar6->field_5).pData = pHVar12;
    goto LAB_0029207f;
  }
  if (pIVar8->fUseBdds == 0) {
    if ((pIVar8->fUseCnfs != 0) || (pIVar8->fUseMv != 0)) {
      dd = (DdManager *)pNtkNew->pManFunc;
      pwVar7 = If_CutTruthW(pIfMan,pCut);
      bVar16 = (pIfObj->CutBest).field_0x1f;
      iVar3 = 1;
      goto LAB_00292021;
    }
    if ((pIVar8->fUseSops == 0) && (pIVar8->nGateSize < 1)) {
      if (pIVar8->fDelayOpt == 0) {
        if (pIVar8->fDsdBalance != 0) {
          pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
          iVar3 = 1;
          goto LAB_00292184;
        }
        if (pIVar8->fUserRecLib == 0) {
          pwVar7 = If_CutTruthW(pIfMan,pCut);
          if (pIfMan->pPars->fUseTtPerm == 0) {
            uVar4 = (uint)(byte)(pIfObj->CutBest).field_0x1f;
          }
          else {
            uVar21 = 0;
            while( true ) {
              uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              uVar4 = uVar1 >> 0x18;
              if (uVar4 <= uVar21) break;
              if (((uint)(pIfObj->CutBest).uMaskFunc >> ((uint)uVar21 & 0x1f) & 1) != 0) {
                bVar16 = (byte)(uVar4 - 6) & 0x1f;
                uVar17 = 1 << bVar16;
                bVar15 = (byte)(1 << ((byte)uVar21 & 0x1f));
                if (uVar4 - 6 == 0 || uVar1 < 0x7000000) {
                  *pwVar7 = (s_Truths6[uVar21] & *pwVar7) >> (bVar15 & 0x3f) |
                            *pwVar7 << (bVar15 & 0x3f) & s_Truths6[uVar21];
                }
                else if (uVar21 < 6) {
                  if (1 << bVar16 < 1) {
                    uVar17 = 0;
                  }
                  for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                    pwVar7[uVar13] =
                         (s_Truths6[uVar21] & pwVar7[uVar13]) >> (bVar15 & 0x3f) |
                         pwVar7[uVar13] << (bVar15 & 0x3f) & s_Truths6[uVar21];
                  }
                }
                else {
                  bVar16 = (byte)uVar21 - 6;
                  uVar4 = 1 << (bVar16 & 0x1f);
                  iVar3 = 2 << (bVar16 & 0x1f);
                  uVar13 = 0;
                  if (0 < (int)uVar4) {
                    uVar13 = (ulong)uVar4;
                  }
                  pwVar18 = pwVar7 + (int)uVar4;
                  for (pwVar14 = pwVar7; pwVar14 < pwVar7 + (int)uVar17; pwVar14 = pwVar14 + iVar3)
                  {
                    for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
                      wVar2 = pwVar14[uVar20];
                      pwVar14[uVar20] = pwVar18[uVar20];
                      pwVar18[uVar20] = wVar2;
                    }
                    pwVar18 = pwVar18 + iVar3;
                  }
                }
              }
              uVar21 = uVar21 + 1;
            }
          }
          pHVar12 = Kit_TruthToHop((Hop_Man_t *)pNtkNew->pManFunc,(uint *)pwVar7,uVar4,vCover);
        }
        else {
          pHVar12 = Abc_RecToHop3((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,pIfObj);
        }
      }
      else {
        pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
        iVar3 = 0;
LAB_00292184:
        pHVar12 = Abc_NodeBuildFromMini(pHVar19,pIfMan,pCut,iVar3);
      }
      (pAVar6->field_5).pData = pHVar12;
    }
    else {
      pwVar7 = If_CutTruthW(pIfMan,pCut);
      uVar4 = Kit_TruthIsop((uint *)pwVar7,(uint)(byte)(pIfObj->CutBest).field_0x1f,vCover,1);
      if (1 < uVar4) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0x1f2,
                      "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                     );
      }
      if ((vCover->nSize == 0) ||
         ((vCover->nSize == 1 && (iVar3 = Vec_IntEntry(vCover,0), iVar3 == 0)))) {
        if (uVar4 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                        ,0x1f6,
                        "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                       );
        }
        pcVar11 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,
                                   (uint)(byte)(pIfObj->CutBest).field_0x1f,(int *)0x0);
        (pAVar6->field_5).pData = pcVar11;
        if (vCover->nSize == 0) {
          pAVar6 = Abc_NtkCreateNodeConst0(pNtkNew);
        }
        else {
          pAVar6 = Abc_NtkCreateNodeConst1(pNtkNew);
        }
      }
      else {
        pcVar11 = Abc_SopCreateFromIsop
                            ((Mem_Flex_t *)pNtkNew->pManFunc,
                             (uint)(byte)(pIfObj->CutBest).field_0x1f,vCover);
        (pAVar6->field_5).pData = pcVar11;
        if (uVar4 != 0) {
          Abc_SopComplement(pcVar11);
        }
      }
    }
  }
  else {
    dd = (DdManager *)pNtkNew->pManFunc;
    pwVar7 = If_CutTruthW(pIfMan,pCut);
    bVar16 = (pIfObj->CutBest).field_0x1f;
    iVar3 = 0;
LAB_00292021:
    n = Kit_TruthToBdd(dd,(uint *)pwVar7,(uint)bVar16,iVar3);
    (pAVar6->field_5).pData = n;
    Cudd_Ref(n);
  }
  if (((((pIfObj->CutBest).field_0x1d & 0x10) != 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
     (pIfMan->pPars->fDsdBalance == 0)) {
    Abc_NodeComplement(pAVar6);
  }
LAB_0029207f:
  (pIfObj->field_22).pCopy = pAVar6;
  return pAVar6;
}

Assistant:

Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNodeNew;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfLeaf;
    int i;
    // return if the result if known
    pNodeNew = (Abc_Obj_t *)If_ObjCopy( pIfObj );
    if ( pNodeNew )
        return pNodeNew;
    assert( pIfObj->Type == IF_AND );
    // get the parameters of the best cut
    pCutBest = If_ObjCutBest( pIfObj );
    if ( pIfMan->pPars->fUserSesLib )
    {
        // create the subgraph composed of Abc_Obj_t nodes based on the given cut
        Abc_Obj_t * pFanins[IF_MAX_FUNC_LUTSIZE];
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            pFanins[i] = Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover);
        pNodeNew = Abc_ExactBuildNode( If_CutTruthW(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), If_CutArrTimeProfile(pIfMan, pCutBest), pFanins, pNtkNew );
        If_ObjSetCopy( pIfObj, pNodeNew );
        return pNodeNew;
    }
    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
//    if ( pIfMan->pPars->pLutLib && pIfMan->pPars->pLutLib->fVarPinDelays )
    if ( !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && !pIfMan->pPars->fUseTtPerm && 
         !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize )
        If_CutRotatePins( pIfMan, pCutBest );
    if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
    {
        If_CutForEachLeafReverse( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    else
    {
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    // set the level of the new node
    pNodeNew->Level = Abc_ObjLevelNew( pNodeNew );
    // derive the function of this node
    if ( pIfMan->pPars->fTruth )
    {
        if ( pIfMan->pPars->fUseBdds )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 0 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 1 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseSops || pIfMan->pPars->nGateSize > 0 ) 
        {
            // transform truth table into the SOP
            int RetValue = Kit_TruthIsop( If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), vCover, 1 );
            assert( RetValue == 0 || RetValue == 1 );
            // check the case of constant cover
            if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
            {
                assert( RetValue == 0 );
                pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), NULL );
                pNodeNew = (Vec_IntSize(vCover) == 0) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew);
            }
            else
            {
                // derive the AIG for that tree
                pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), vCover );
                if ( RetValue )
                    Abc_SopComplement( (char *)pNodeNew->pData );
            }
        }
        else if ( pIfMan->pPars->fDelayOpt )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 0 );
        else if ( pIfMan->pPars->fDsdBalance )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 1 );
        else if ( pIfMan->pPars->fUserRecLib )
        {
            extern Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj );
            pNodeNew->pData = Abc_RecToHop3( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, pIfObj ); 
        }
        else
        {
            extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
            word * pTruth = If_CutTruthW(pIfMan, pCutBest);
            if ( pIfMan->pPars->fUseTtPerm )
                for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
                    if ( If_CutLeafBit(pCutBest, i) )
                        Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), i );
            pNodeNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtkNew->pManFunc, (unsigned *)pTruth, If_CutLeaveNum(pCutBest), vCover );
//            if ( pIfMan->pPars->fUseBat )
//                Bat_ManFuncPrintCell( *pTruth );
        }
        // complement the node if the cut was complemented
        if ( pCutBest->fCompl && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDsdBalance )
            Abc_NodeComplement( pNodeNew );
    }
    else
    {
        pNodeNew->pData = Abc_NodeIfToHop( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pIfObj );
    }
    If_ObjSetCopy( pIfObj, pNodeNew );
    return pNodeNew;
}